

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O3

int cache_get6(uint64_t a,uint64_t b,uint64_t c,uint64_t d,uint64_t e,uint64_t f,uint64_t *res1,
              uint64_t *res2)

{
  ulong uVar1;
  uint32_t *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  cache_entry_t pcVar6;
  
  puVar2 = cache_status;
  uVar4 = ((((((a >> 0x20 ^ a ^ 0xcbf29ce484222325) * 0x100000001b3 ^ b) * 0x100000001b3 ^ c) *
             0x100000001b3 ^ d) * 0x100000001b3 ^ e) * 0x100000001b3 ^ f) * 0x100000001b3;
  uVar5 = (cache_mask & uVar4) >> 1;
  pcVar6 = cache_table + uVar5 * 2;
  uVar1 = *(ulong *)(cache_status + uVar5 * 2);
  uVar3 = 0;
  if (((((uVar1 & 0xffff0000ffff0000) ==
         ((uVar4 & 0xffffffff00000000 | uVar4 >> 0x20) & 0x7bff00007bff0000 | 0x400000004000000)) &&
       (pcVar6->a == a)) && (pcVar6->b == b)) &&
     (((pcVar6->c == c && (pcVar6[1].a == d)) && ((pcVar6[1].b == e && (pcVar6[1].c == f)))))) {
    *res1 = pcVar6->res;
    if (res2 != (uint64_t *)0x0) {
      *res2 = pcVar6[1].res;
    }
    uVar3 = (uint)(*(ulong *)(puVar2 + uVar5 * 2) == uVar1);
  }
  return uVar3;
}

Assistant:

int
cache_get6(uint64_t a, uint64_t b, uint64_t c, uint64_t d, uint64_t e, uint64_t f, uint64_t *res1, uint64_t *res2)
{
    const uint64_t hash = cache_hash6(a, b, c, d, e, f);
#if CACHE_MASK
    _Atomic(uint64_t) *s_bucket = (_Atomic(uint64_t)*)cache_status + (hash & cache_mask)/2;
    cache6_entry_t bucket = (cache6_entry_t)cache_table + (hash & cache_mask)/2;
#else
    _Atomic(uint64_t) *s_bucket = (_Atomic(uint64_t)*)cache_status + (hash % cache_size)/2;
    cache6_entry_t bucket = (cache6_entry_t)cache_table + (hash % cache_size)/2;
#endif
    // can be relaxed, we check again afterwards
    const uint64_t s = atomic_load_explicit(s_bucket, memory_order_relaxed);
    // abort if locked or second part of 2-part entry or if different hash
    uint64_t x = ((hash>>32) & 0x7fff0000) | 0x04000000;
    x = x | (x<<32);
    if ((s & 0xffff0000ffff0000) != x) return 0;
    // abort if key different
    if (bucket->a != a || bucket->b != b || bucket->c != c) return 0;
    if (bucket->d != d || bucket->e != e || bucket->f != f) return 0;
    *res1 = bucket->res;
    if (res2) *res2 = bucket->res2;
    // abort if status field changed after compiler_barrier()
    return atomic_load_explicit(s_bucket, memory_order_acquire) == s ? 1 : 0;
}